

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  _func_int_sqlite3_vtab_ptr_char_ptr_char_ptr_int_char_ptr_ptr **pp_Var1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  Fts5Config *pFVar5;
  sqlite3_module *psVar6;
  Fts5Storage *pFVar7;
  bool bVar8;
  sqlite3_stmt *pStmt;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar9;
  int iVar10;
  _func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int *p_Var11;
  char *pcVar12;
  long lVar13;
  i64 iDel;
  Mem *pMVar14;
  i64 iVar15;
  sqlite3_value *psVar16;
  Fts5Structure *pFVar17;
  Fts5Structure *pFVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  Fts5Index *pFVar22;
  ushort uVar23;
  long in_FS_OFFSET;
  bool bVar24;
  bool bVar25;
  int nLoc;
  char *pText;
  int nText;
  int rc;
  sqlite3_stmt *pScan;
  Fts5Buffer buf;
  int local_90;
  int local_8c;
  uchar *local_88;
  int local_7c;
  char *local_78;
  int local_70;
  int local_6c;
  Fts5Storage *local_68;
  undefined8 uStack_60;
  sqlite3_stmt *local_50;
  Fts5Buffer local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar5 = (Fts5Config *)pVtab[1].pModule;
  local_90 = 0;
  if ((pFVar5->pgsz == 0) &&
     (iVar10 = sqlite3Fts5ConfigLoad(pFVar5,pFVar5->iCookie), local_90 = iVar10, iVar10 != 0))
  goto LAB_001dbaa2;
  psVar6 = pVtab[1].pModule;
  psVar6[1].xOpen = (_func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *)&pVtab->zErrMsg;
  for (p_Var11 = (pVtab[2].pModule)->xColumn;
      p_Var11 != (_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int *)0x0;
      p_Var11 = *(_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int **)(p_Var11 + 8)) {
    if ((*(int *)(p_Var11 + 0x20) == 1) && (*(sqlite3_vtab **)p_Var11 == pVtab)) {
      p_Var11[0x50] =
           (_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int)((byte)p_Var11[0x50] | 0x20);
    }
  }
  uVar23 = (*apVal)->flags & 0x3f;
  if (((0xaaaaaaaaaaaaaaaaU >> uVar23 & 1) == 0) ||
     (psVar16 = apVal[(long)pFVar5->nCol + 2], uVar3._0_2_ = psVar16->flags,
     uVar3._2_1_ = psVar16->enc, uVar3._3_1_ = psVar16->eSubtype,
     (0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
    if ((pFVar5->eContent == 0) || (pFVar5->bContentlessDelete != 0)) {
      bVar25 = pFVar5->db->vtabOnConflict == '\x05';
    }
    else {
      bVar25 = false;
    }
    if (nArg == 1) {
      if ((((ulong)psVar6->xNext & 0xfffffffd) == 1) && (pFVar5->bContentlessDelete == 0)) {
        fts5SetVtabError((Fts5FullTable *)pVtab,"cannot DELETE from contentless fts5 table: %s",
                         pFVar5->zName);
        local_90 = 1;
        iVar10 = extraout_EAX_00;
      }
      else {
        iVar15 = sqlite3VdbeIntValue(*apVal);
        iVar10 = sqlite3Fts5StorageDelete
                           ((Fts5Storage *)pVtab[1].zErrMsg,iVar15,(sqlite3_value **)0x0,0);
        local_90 = iVar10;
      }
LAB_001db4af:
      iVar19 = 0;
    }
    else {
      iVar10 = sqlite3_value_numeric_type(apVal[1]);
      iVar9 = local_90;
      if (pFVar5->bLocale == 0) {
        if (pFVar5->nCol < 1) {
          iVar19 = 0;
        }
        else {
          lVar13 = 0;
          do {
            iVar19 = sqlite3Fts5IsLocaleValue(pFVar5,apVal[lVar13 + 2]);
            if (iVar19 != 0) {
              fts5SetVtabError((Fts5FullTable *)pVtab,"fts5_locale() requires locale=1");
              iVar19 = 5;
              iVar9 = 0x14;
              goto LAB_001db29e;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < pFVar5->nCol);
          iVar19 = 0;
        }
LAB_001db29e:
        local_90 = iVar9;
        if (iVar19 == 0) goto LAB_001db032;
      }
      else {
LAB_001db032:
        if ((0x50505050UL >> uVar23 & 1) == 0) {
          if ((bool)(bVar25 & iVar10 == 1)) {
            iVar15 = sqlite3VdbeIntValue(apVal[1]);
            local_90 = sqlite3Fts5StorageDelete
                                 ((Fts5Storage *)pVtab[1].zErrMsg,iVar15,(sqlite3_value **)0x0,0);
          }
          fts5StorageInsert(&local_90,(Fts5FullTable *)pVtab,apVal,pRowid);
          iVar10 = extraout_EAX;
        }
        else {
          pFVar7 = (Fts5Storage *)pVtab[1].zErrMsg;
          iVar15 = sqlite3VdbeIntValue(*apVal);
          iDel = sqlite3VdbeIntValue(apVal[1]);
          bVar24 = false;
          if (((ulong)(pVtab[1].pModule)->xNext & 0xfffffffd) == 1) {
            iVar9 = 0;
            bVar8 = true;
            iVar19 = 0;
            bVar24 = true;
            if (0 < (long)pFVar5->nCol) {
              lVar13 = 0;
              iVar20 = 0;
              iVar19 = 0;
              do {
                if (pFVar5->abUnindexed[lVar13] == '\0') {
                  psVar16 = apVal[lVar13 + 2];
                  uVar4._0_2_ = psVar16->flags;
                  uVar4._2_1_ = psVar16->enc;
                  uVar4._3_1_ = psVar16->eSubtype;
                  if ((~uVar4 & 0x401) == 0) {
                    iVar20 = iVar20 + 1;
                  }
                  else {
                    iVar19 = iVar19 + 1;
                  }
                }
                lVar13 = lVar13 + 1;
              } while (pFVar5->nCol != lVar13);
              bVar24 = iVar20 == 0;
            }
            if (iVar19 == 0 && iVar15 == iDel) {
              bVar24 = true;
            }
            else {
              if (bVar24) {
                bVar24 = false;
                iVar9 = 0;
                if (pFVar5->bContentlessDelete != 0) goto LAB_001db2ba;
              }
              pcVar12 = "%s a subset of columns on fts5 contentless-delete table: %s";
              if (pFVar5->bContentlessDelete == 0) {
                pcVar12 = "%s contentless fts5 table: %s";
              }
              bVar24 = false;
              sqlite3Fts5ConfigErrmsg(pFVar5,pcVar12,"cannot UPDATE",pFVar5->zName);
              iVar9 = 1;
              bVar8 = false;
            }
LAB_001db2ba:
            local_90 = iVar9;
            if (bVar8) goto LAB_001db2c7;
            iVar19 = 5;
            iVar10 = 0;
          }
          else {
LAB_001db2c7:
            if (iVar10 == 1) {
              if (iVar15 == iDel) {
                if (bVar24) {
                  local_90 = sqlite3Fts5StorageFindDeleteRow(pFVar7,iVar15);
                  if (local_90 == 0) {
                    local_90 = sqlite3Fts5StorageContentInsert(pFVar7,1,apVal,pRowid);
                  }
                }
                else {
                  local_90 = sqlite3Fts5StorageDelete(pFVar7,iVar15,(sqlite3_value **)0x0,1);
LAB_001db47e:
                  fts5StorageInsert(&local_90,(Fts5FullTable *)pVtab,apVal,pRowid);
                }
              }
              else {
                if (bVar25) {
                  local_90 = sqlite3Fts5StorageDelete(pFVar7,iVar15,(sqlite3_value **)0x0,1);
                  if (local_90 == 0) {
                    local_90 = sqlite3Fts5StorageDelete(pFVar7,iDel,(sqlite3_value **)0x0,0);
                  }
                  goto LAB_001db47e;
                }
                local_90 = sqlite3Fts5StorageFindDeleteRow(pFVar7,iVar15);
                if (local_90 == 0) {
                  local_90 = sqlite3Fts5StorageContentInsert(pFVar7,0,apVal,pRowid);
                }
                if (local_90 == 0) {
                  local_90 = sqlite3Fts5StorageDelete(pFVar7,iVar15,(sqlite3_value **)0x0,0);
                }
                if (local_90 == 0) {
                  local_90 = sqlite3Fts5StorageIndexInsert(pFVar7,apVal,*pRowid);
                }
              }
            }
            else {
              local_90 = 0x14;
            }
            iVar10 = sqlite3_reset(pFVar7->pSavedRow);
            pFVar7->pSavedRow = (sqlite3_stmt *)0x0;
            iVar19 = 0;
            iVar10 = (int)CONCAT71((uint7)(uint3)((uint)iVar10 >> 8),1);
          }
          if ((char)iVar10 == '\0') goto LAB_001db4ab;
        }
        iVar19 = 0;
      }
LAB_001db4ab:
      if (iVar19 == 0) goto LAB_001db4af;
    }
    iVar9 = local_90;
    if ((iVar19 != 5) && (iVar19 != 0)) goto LAB_001dbaa2;
    goto LAB_001dba8f;
  }
  pcVar12 = (char *)sqlite3ValueText(psVar16,'\x01');
  if ((pFVar5->eContent != 0) && (pcVar12 != (char *)0x0)) {
    lVar13 = 0;
    do {
      bVar2 = "secure-delete"[lVar13 + 7];
      if (bVar2 == pcVar12[lVar13]) {
        if ((ulong)bVar2 == 0) goto LAB_001db21d;
      }
      else if (""[bVar2] != ""[(byte)pcVar12[lVar13]]) break;
      lVar13 = lVar13 + 1;
    } while( true );
  }
  pMVar14 = apVal[(long)pFVar5->nCol + 3];
  local_8c = 0;
  if (pcVar12 != (char *)0x0) {
    lVar13 = 0;
    do {
      bVar2 = "delete-all"[lVar13];
      if (bVar2 == pcVar12[lVar13]) {
        if ((ulong)bVar2 == 0) goto LAB_001db247;
      }
      else if (""[bVar2] != ""[(byte)pcVar12[lVar13]]) {
        if (pcVar12 == (char *)0x0) break;
        lVar13 = 0;
        goto LAB_001db271;
      }
      lVar13 = lVar13 + 1;
    } while( true );
  }
LAB_001dba00:
  iVar9 = sqlite3Fts5FlushToDisk((Fts5Table *)pVtab);
  if (iVar9 == 0) {
    pFVar22 = *(Fts5Index **)&pVtab[1].nRef;
    pFVar18 = fts5StructureRead(pFVar22);
    fts5StructureRelease(pFVar18);
    iVar9 = pFVar22->rc;
    pFVar22->rc = 0;
  }
  if (iVar9 == 0) {
    iVar9 = sqlite3Fts5ConfigSetValue((Fts5Config *)pVtab[1].pModule,pcVar12,pMVar14,&local_8c);
  }
  if (iVar9 != 0) goto LAB_001dba56;
  if (local_8c != 0) {
    iVar9 = 1;
    goto LAB_001dba56;
  }
  bVar25 = false;
  iVar9 = sqlite3Fts5StorageConfigValue((Fts5Storage *)pVtab[1].zErrMsg,pcVar12,pMVar14,0);
  goto LAB_001dba58;
LAB_001db21d:
  if (pFVar5->bContentlessDelete == 0) {
    iVar9 = fts5SpecialDelete((Fts5FullTable *)pVtab,apVal);
  }
  else {
    fts5SetVtabError((Fts5FullTable *)pVtab,
                     "\'delete\' may not be used with a contentless_delete=1 table");
    local_90 = 1;
    iVar9 = local_90;
  }
  goto LAB_001dba8f;
LAB_001db271:
  bVar2 = "rebuild"[lVar13];
  if (bVar2 == pcVar12[lVar13]) {
    if ((ulong)bVar2 == 0) goto LAB_001db391;
  }
  else if (""[bVar2] != ""[(byte)pcVar12[lVar13]]) {
    if (pcVar12 == (char *)0x0) goto LAB_001dba00;
    lVar13 = 0;
    goto LAB_001db3cd;
  }
  lVar13 = lVar13 + 1;
  goto LAB_001db271;
LAB_001db3cd:
  bVar2 = "optimize"[lVar13];
  if (bVar2 == pcVar12[lVar13]) {
    if ((ulong)bVar2 == 0) goto LAB_001db799;
  }
  else if (""[bVar2] != ""[(byte)pcVar12[lVar13]]) {
    if (pcVar12 == (char *)0x0) goto LAB_001dba00;
    lVar13 = 0;
    goto LAB_001db881;
  }
  lVar13 = lVar13 + 1;
  goto LAB_001db3cd;
LAB_001db881:
  bVar2 = "deletemerge"[lVar13 + 6];
  if (bVar2 == pcVar12[lVar13]) {
    if ((ulong)bVar2 == 0) goto LAB_001db8a9;
  }
  else if (""[bVar2] != ""[(byte)pcVar12[lVar13]]) {
    if (pcVar12 == (char *)0x0) goto LAB_001dba00;
    lVar13 = 0;
    goto LAB_001db98f;
  }
  lVar13 = lVar13 + 1;
  goto LAB_001db881;
LAB_001db98f:
  bVar2 = "integrity-check"[lVar13];
  if (bVar2 == pcVar12[lVar13]) {
    if ((ulong)bVar2 == 0) goto LAB_001db9b3;
  }
  else if (""[bVar2] != ""[(byte)pcVar12[lVar13]]) {
    if (pcVar12 == (char *)0x0) goto LAB_001dba00;
    lVar13 = 0;
    goto LAB_001db9d9;
  }
  lVar13 = lVar13 + 1;
  goto LAB_001db98f;
LAB_001db9d9:
  bVar2 = "flush"[lVar13];
  if (bVar2 == pcVar12[lVar13]) {
    if ((ulong)bVar2 == 0) goto LAB_001dbadf;
  }
  else if (""[bVar2] != ""[(byte)pcVar12[lVar13]]) goto LAB_001dba00;
  lVar13 = lVar13 + 1;
  goto LAB_001db9d9;
LAB_001dbadf:
  iVar9 = sqlite3Fts5FlushToDisk((Fts5Table *)pVtab);
  goto LAB_001dba56;
LAB_001db9b3:
  iVar15 = sqlite3VdbeIntValue(pMVar14);
  iVar9 = sqlite3Fts5StorageIntegrity((Fts5Storage *)pVtab[1].zErrMsg,(int)iVar15);
  goto LAB_001dba56;
LAB_001db8a9:
  iVar15 = sqlite3VdbeIntValue(pMVar14);
  iVar10 = (int)iVar15;
  pFVar22 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
  local_48.p = (u8 *)0x0;
  fts5IndexFlush(pFVar22);
  pFVar18 = fts5StructureRead(pFVar22);
  local_48.p = (u8 *)pFVar18;
  if (pFVar18 != (Fts5Structure *)0x0) {
    iVar9 = pFVar22->pConfig->nUsermerge;
    if (pFVar22->pStruct != (Fts5Structure *)0x0) {
      fts5StructureRelease(pFVar22->pStruct);
      pFVar22->pStruct = (Fts5Structure *)0x0;
    }
    if (iVar10 < 0) {
      pFVar17 = fts5IndexOptimizeStruct(pFVar22,pFVar18);
      fts5StructureRelease(pFVar18);
      iVar10 = -iVar10;
      iVar9 = 1;
      local_48.p = (u8 *)pFVar17;
    }
    pFVar18 = (Fts5Structure *)local_48.p;
    if ((((Fts5Structure *)local_48.p != (Fts5Structure *)0x0) &&
        (*(int *)((long)local_48.p + 0x1c) != 0)) &&
       (iVar10 = fts5IndexMerge(pFVar22,(Fts5Structure **)&local_48,iVar10,iVar9),
       pFVar18 = (Fts5Structure *)local_48.p, iVar10 != 0)) {
      fts5StructureWrite(pFVar22,(Fts5Structure *)local_48.p);
      pFVar18 = (Fts5Structure *)local_48.p;
    }
    goto LAB_001db96b;
  }
  goto LAB_001db970;
LAB_001db391:
  if (((ulong)(pVtab[1].pModule)->xNext & 0xfffffffd) == 1) {
    pcVar12 = "\'rebuild\' may not be used with a contentless fts5 table";
    goto LAB_001db3a7;
  }
  pFVar7 = (Fts5Storage *)pVtab[1].zErrMsg;
  local_48.p = (u8 *)0x0;
  local_48.n = 0;
  local_48.nSpace = 0;
  pFVar5 = pFVar7->pConfig;
  local_50 = (sqlite3_stmt *)0x0;
  local_6c = -0x55555556;
  uStack_60 = 0;
  local_68 = pFVar7;
  local_6c = sqlite3Fts5StorageDeleteAll(pFVar7);
  if (local_6c == 0) {
    local_6c = fts5StorageLoadTotals(pFVar7,1);
  }
  if (local_6c == 0) {
    local_6c = fts5StorageGetStmt(pFVar7,0xb,&local_50,pFVar5->pzErrmsg);
  }
  pStmt = local_50;
  bVar25 = local_6c == 0;
  if (bVar25) {
    iVar10 = sqlite3_step(local_50);
    while (iVar10 == 100) {
      pMVar14 = columnMem(pStmt,0);
      iVar15 = sqlite3VdbeIntValue(pMVar14);
      columnMallocFailure(pStmt);
      local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
      local_6c = sqlite3Fts5IndexBeginWrite(pFVar7->pIndex,0,iVar15);
      uStack_60 = uStack_60 & 0xffffffff00000000;
      if (local_6c == 0) {
        iVar10 = 0;
        if (0 < pFVar5->nCol) {
          iVar9 = 0;
          do {
            uStack_60 = uStack_60 & 0xffffffff;
            if (pFVar5->abUnindexed[iVar9] == '\0') {
              local_70 = 0;
              local_78 = (char *)0x0;
              local_7c = 0;
              local_88 = (uchar *)0x0;
              psVar16 = sqlite3_column_value(pStmt,iVar9 + 1);
              if ((pFVar5->eContent == 2) &&
                 (iVar10 = sqlite3Fts5IsLocaleValue(pFVar5,psVar16), iVar10 != 0)) {
                local_6c = sqlite3Fts5DecodeLocaleValue
                                     (psVar16,&local_78,&local_70,(char **)&local_88,&local_7c);
              }
              else {
                local_78 = (char *)sqlite3ValueText(psVar16,'\x01');
                local_70 = sqlite3ValueBytes(psVar16,'\x01');
                if (pFVar5->bLocale != 0) {
                  iVar10 = (int)uStack_60 + pFVar5->nCol + 1;
                  local_88 = sqlite3_column_text(pStmt,iVar10);
                  local_7c = sqlite3_column_bytes(pStmt,iVar10);
                }
              }
              if (local_6c == 0) {
                (pFVar5->t).pLocale = (char *)local_88;
                (pFVar5->t).nLocale = local_7c;
                local_6c = sqlite3Fts5Tokenize(pFVar5,4,local_78,local_70,&local_68,
                                               fts5StorageInsertCallback);
                (pFVar5->t).pLocale = (char *)0x0;
                (pFVar5->t).nLocale = 0;
              }
            }
            sqlite3Fts5BufferAppendVarint(&local_6c,&local_48,(long)uStack_60._4_4_);
            pFVar7->aTotalSize[(int)uStack_60] =
                 pFVar7->aTotalSize[(int)uStack_60] + (long)uStack_60._4_4_;
            iVar9 = (int)uStack_60 + 1;
            uStack_60 = CONCAT44(uStack_60._4_4_,iVar9);
            if (local_6c != 0) goto LAB_001db5ac;
            iVar10 = local_6c;
          } while (iVar9 < pFVar5->nCol);
        }
        local_6c = iVar10;
        pFVar7->nTotalRow = pFVar7->nTotalRow + 1;
        local_6c = fts5StorageInsertDocsize(pFVar7,iVar15,&local_48);
      }
      else {
LAB_001db5ac:
        pFVar7->nTotalRow = pFVar7->nTotalRow + 1;
      }
      bVar25 = local_6c == 0;
      if (!bVar25) goto LAB_001db75d;
      iVar10 = sqlite3_step(pStmt);
    }
    bVar25 = true;
  }
LAB_001db75d:
  sqlite3_free(local_48.p);
  iVar10 = sqlite3_reset(local_50);
  if (bVar25) {
    local_6c = iVar10;
  }
  iVar9 = local_6c;
  if (local_6c == 0) {
    iVar9 = fts5StorageSaveTotals(pFVar7);
    local_6c = iVar9;
  }
  goto LAB_001db791;
LAB_001db247:
  if (*(int *)&(pVtab[1].pModule)->xNext == 0) {
    pcVar12 = "\'delete-all\' may only be used with a contentless or external content fts5 table";
LAB_001db3a7:
    fts5SetVtabError((Fts5FullTable *)pVtab,pcVar12);
    iVar9 = 1;
  }
  else {
    iVar9 = sqlite3Fts5StorageDeleteAll((Fts5Storage *)pVtab[1].zErrMsg);
  }
LAB_001db791:
  bVar25 = true;
  goto LAB_001dba58;
LAB_001db799:
  pFVar22 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
  local_48.p = (u8 *)0x0;
  fts5IndexFlush(pFVar22);
  pFVar18 = fts5StructureRead(pFVar22);
  if (pFVar22->pStruct != (Fts5Structure *)0x0) {
    fts5StructureRelease(pFVar22->pStruct);
    pFVar22->pStruct = (Fts5Structure *)0x0;
  }
  if (pFVar18 != (Fts5Structure *)0x0) {
    local_48.p = (u8 *)fts5IndexOptimizeStruct(pFVar22,pFVar18);
  }
  fts5StructureRelease(pFVar18);
  if ((Fts5Structure *)local_48.p != (Fts5Structure *)0x0) {
    iVar10 = -1;
    lVar13 = 0;
    do {
      lVar21 = lVar13;
      iVar10 = iVar10 + 1;
      lVar13 = lVar21 + 0x10;
    } while (*(int *)((long)&((Fts5StructureLevel *)((long)local_48.p + 0x20))->nSeg + lVar21) == 0)
    ;
    if (pFVar22->rc == 0) {
      do {
        if (*(int *)((long)&((Fts5StructureLevel *)((long)local_48.p + 0x20))->nSeg + lVar21) < 1)
        break;
        local_68 = (Fts5Storage *)CONCAT44(local_68._4_4_,1000);
        fts5IndexMergeLevel(pFVar22,(Fts5Structure **)&local_48,iVar10,(int *)&local_68);
      } while (pFVar22->rc == 0);
    }
    pFVar18 = (Fts5Structure *)local_48.p;
    fts5StructureWrite(pFVar22,(Fts5Structure *)local_48.p);
LAB_001db96b:
    fts5StructureRelease(pFVar18);
  }
LAB_001db970:
  iVar9 = pFVar22->rc;
  pFVar22->rc = 0;
LAB_001dba56:
  bVar25 = false;
LAB_001dba58:
  if ((bVar25) && (iVar9 == 0)) {
    pp_Var1 = &(pVtab[1].pModule)->xIntegrity;
    *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
    pFVar22 = *(Fts5Index **)&pVtab[1].nRef;
    pFVar18 = fts5StructureRead(pFVar22);
    fts5StructureRelease(pFVar18);
    iVar9 = pFVar22->rc;
    pFVar22->rc = 0;
  }
LAB_001dba8f:
  local_90 = iVar9;
  pVtab[1].pModule[1].xOpen = (_func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *)0x0;
  iVar10 = local_90;
LAB_001dbaa2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar10;
}

Assistant:

static int fts5UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  Fts5Config *pConfig = pTab->p.pConfig;
  int eType0;                     /* value_type() of apVal[0] */
  int rc = SQLITE_OK;             /* Return code */

  /* A transaction must be open when this is called. */
  assert( pTab->ts.eState==1 || pTab->ts.eState==2 );

  assert( pVtab->zErrMsg==0 );
  assert( nArg==1 || nArg==(2+pConfig->nCol+2) );
  assert( sqlite3_value_type(apVal[0])==SQLITE_INTEGER
       || sqlite3_value_type(apVal[0])==SQLITE_NULL
  );
  assert( pTab->p.pConfig->pzErrmsg==0 );
  if( pConfig->pgsz==0 ){
    rc = sqlite3Fts5ConfigLoad(pTab->p.pConfig, pTab->p.pConfig->iCookie);
    if( rc!=SQLITE_OK ) return rc;
  }

  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Put any active cursors into REQUIRE_SEEK state. */
  fts5TripCursors(pTab);

  eType0 = sqlite3_value_type(apVal[0]);
  if( eType0==SQLITE_NULL
   && sqlite3_value_type(apVal[2+pConfig->nCol])!=SQLITE_NULL
  ){
    /* A "special" INSERT op. These are handled separately. */
    const char *z = (const char*)sqlite3_value_text(apVal[2+pConfig->nCol]);
    if( pConfig->eContent!=FTS5_CONTENT_NORMAL
      && 0==sqlite3_stricmp("delete", z)
    ){
      if( pConfig->bContentlessDelete ){
        fts5SetVtabError(pTab,
            "'delete' may not be used with a contentless_delete=1 table"
        );
        rc = SQLITE_ERROR;
      }else{
        rc = fts5SpecialDelete(pTab, apVal);
      }
    }else{
      rc = fts5SpecialInsert(pTab, z, apVal[2 + pConfig->nCol + 1]);
    }
  }else{
    /* A regular INSERT, UPDATE or DELETE statement. The trick here is that
    ** any conflict on the rowid value must be detected before any
    ** modifications are made to the database file. There are 4 cases:
    **
    **   1) DELETE
    **   2) UPDATE (rowid not modified)
    **   3) UPDATE (rowid modified)
    **   4) INSERT
    **
    ** Cases 3 and 4 may violate the rowid constraint.
    */
    int eConflict = SQLITE_ABORT;
    if( pConfig->eContent==FTS5_CONTENT_NORMAL || pConfig->bContentlessDelete ){
      eConflict = sqlite3_vtab_on_conflict(pConfig->db);
    }

    assert( eType0==SQLITE_INTEGER || eType0==SQLITE_NULL );
    assert( nArg!=1 || eType0==SQLITE_INTEGER );

    /* DELETE */
    if( nArg==1 ){
      /* It is only possible to DELETE from a contentless table if the
      ** contentless_delete=1 flag is set. */
      if( fts5IsContentless(pTab, 1) && pConfig->bContentlessDelete==0 ){
        fts5SetVtabError(pTab,
            "cannot DELETE from contentless fts5 table: %s", pConfig->zName
        );
        rc = SQLITE_ERROR;
      }else{
        i64 iDel = sqlite3_value_int64(apVal[0]);  /* Rowid to delete */
        rc = sqlite3Fts5StorageDelete(pTab->pStorage, iDel, 0, 0);
      }
    }

    /* INSERT or UPDATE */
    else{
      int eType1 = sqlite3_value_numeric_type(apVal[1]);

      /* It is an error to write an fts5_locale() value to a table without
      ** the locale=1 option. */
      if( pConfig->bLocale==0 ){
        int ii;
        for(ii=0; ii<pConfig->nCol; ii++){
          sqlite3_value *pVal = apVal[ii+2];
          if( sqlite3Fts5IsLocaleValue(pConfig, pVal) ){
            fts5SetVtabError(pTab, "fts5_locale() requires locale=1");
            rc = SQLITE_MISMATCH;
            goto update_out;
          }
        }
      }

      if( eType0!=SQLITE_INTEGER ){
        /* An INSERT statement. If the conflict-mode is REPLACE, first remove
        ** the current entry (if any). */
        if( eConflict==SQLITE_REPLACE && eType1==SQLITE_INTEGER ){
          i64 iNew = sqlite3_value_int64(apVal[1]);  /* Rowid to delete */
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0, 0);
        }
        fts5StorageInsert(&rc, pTab, apVal, pRowid);
      }

      /* UPDATE */
      else{
        Fts5Storage *pStorage = pTab->pStorage;
        i64 iOld = sqlite3_value_int64(apVal[0]);  /* Old rowid */
        i64 iNew = sqlite3_value_int64(apVal[1]);  /* New rowid */
        int bContent = 0;         /* Content only update */

        /* If this is a contentless table (including contentless_unindexed=1
        ** tables), check if the UPDATE may proceed.  */
        if( fts5IsContentless(pTab, 1) ){
          rc = fts5ContentlessUpdate(pConfig, &apVal[2], iOld!=iNew, &bContent);
          if( rc!=SQLITE_OK ) goto update_out;
        }

        if( eType1!=SQLITE_INTEGER ){
          rc = SQLITE_MISMATCH;
        }else if( iOld!=iNew ){
          assert( bContent==0 );
          if( eConflict==SQLITE_REPLACE ){
            rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 1);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pStorage, iNew, 0, 0);
            }
            fts5StorageInsert(&rc, pTab, apVal, pRowid);
          }else{
            rc = sqlite3Fts5StorageFindDeleteRow(pStorage, iOld);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageContentInsert(pStorage, 0, apVal, pRowid);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 0);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageIndexInsert(pStorage, apVal, *pRowid);
            }
          }
        }else if( bContent ){
          /* This occurs when an UPDATE on a contentless table affects *only*
          ** UNINDEXED columns. This is a no-op for contentless_unindexed=0
          ** tables, or a write to the %_content table only for =1 tables.  */
          assert( fts5IsContentless(pTab, 1) );
          rc = sqlite3Fts5StorageFindDeleteRow(pStorage, iOld);
          if( rc==SQLITE_OK ){
            rc = sqlite3Fts5StorageContentInsert(pStorage, 1, apVal, pRowid);
          }
        }else{
          rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 1);
          fts5StorageInsert(&rc, pTab, apVal, pRowid);
        }
        sqlite3Fts5StorageReleaseDeleteRow(pStorage);
      }
    }
  }

 update_out:
  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}